

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

void lws_hex_from_byte_array(uint8_t *src,size_t slen,char *dest,size_t len)

{
  char *pcVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  
  pcVar4 = dest + (len - 1);
  sVar5 = 0;
  do {
    if ((slen == sVar5) || (dest == pcVar4)) break;
    bVar2 = src[sVar5];
    pcVar1 = dest + 1;
    *dest = "0123456789abcdef"[bVar2 >> 4];
    pcVar3 = pcVar1;
    if (pcVar1 != pcVar4) {
      dest[1] = "0123456789abcdef"[bVar2 & 0xf];
      pcVar3 = dest + 2;
    }
    dest = pcVar3;
    sVar5 = sVar5 + 1;
  } while (pcVar1 != pcVar4);
  *dest = '\0';
  return;
}

Assistant:

void
lws_hex_from_byte_array(const uint8_t *src, size_t slen, char *dest, size_t len)
{
	char *end = &dest[len - 1];

	while (slen-- && dest != end) {
		uint8_t b = *src++;
		*dest++ = hexch[b >> 4];
		if (dest == end)
			break;
		*dest++ = hexch[b & 0xf];
	}

	*dest = '\0';
}